

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

size_t utf8_line_length(utf8_char_t *data)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  
  if (*data == '\0') {
    return 0;
  }
  sVar3 = 0;
  do {
    bVar2 = *data;
    if (bVar2 == 0xd) {
      bVar5 = 10;
LAB_00104cd0:
      lVar4 = (ulong)(((byte *)data)[1] == bVar5) + 1;
    }
    else {
      if (bVar2 == 10) {
        bVar5 = 0xd;
        goto LAB_00104cd0;
      }
      lVar4 = 0;
    }
    if (lVar4 != 0) {
      return sVar3 + lVar4;
    }
    if (bVar2 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)((long)utf8_char_length::_utf8_char_length + (ulong)(bVar2 & 0xfffffff8));
    }
    data = (utf8_char_t *)((byte *)data + lVar4);
    sVar1 = sVar3 + 1;
    lVar4 = sVar3 + 1;
    sVar3 = sVar1;
    if (((byte *)data)[lVar4] == 0) {
      return sVar1;
    }
  } while( true );
}

Assistant:

size_t utf8_line_length(const utf8_char_t* data)
{
    size_t n, len = 0;

    for (len = 0; 0 != data[len]; ++len) {
        if (0 < (n = _utf8_newline(data))) {
            return len + n;
        }

        data += utf8_char_length(data);
    }

    return len;
}